

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O2

optional<spv::Capability>
spvtools::opt::Handler_OpImageWrite_StorageImageWriteWithoutFormat(Instruction *instruction)

{
  uint32_t uVar1;
  DefUseManager *this;
  Instruction *pIVar2;
  
  if (instruction->opcode_ == OpImageWrite) {
    this = IRContext::get_def_use_mgr(instruction->context_);
    uVar1 = Instruction::GetSingleWordInOperand(instruction,0);
    pIVar2 = analysis::DefUseManager::GetDef(this,uVar1);
    uVar1 = Instruction::type_id(pIVar2);
    pIVar2 = analysis::DefUseManager::GetDef(this,uVar1);
    uVar1 = Instruction::GetSingleWordInOperand(pIVar2,6);
    return (_Optional_base<spv::Capability,_true,_true>)
           (_Optional_base<spv::Capability,_true,_true>)((ulong)(uVar1 == 0) << 0x20 | 0x38);
  }
  __assert_fail("instruction->opcode() == spv::Op::OpImageWrite && \"This handler only support OpImageWrite opcodes.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/trim_capabilities_pass.cpp"
                ,0x164,
                "std::optional<spv::Capability> spvtools::opt::Handler_OpImageWrite_StorageImageWriteWithoutFormat(const Instruction *)"
               );
}

Assistant:

static std::optional<spv::Capability>
Handler_OpImageWrite_StorageImageWriteWithoutFormat(
    const Instruction* instruction) {
  assert(instruction->opcode() == spv::Op::OpImageWrite &&
         "This handler only support OpImageWrite opcodes.");
  const auto* def_use_mgr = instruction->context()->get_def_use_mgr();

  const uint32_t image_index =
      instruction->GetSingleWordInOperand(kOpImageWriteImageIndex);
  const uint32_t type_index = def_use_mgr->GetDef(image_index)->type_id();

  // If the Image Format is Unknown, StorageImageWriteWithoutFormat is required.
  const Instruction* type = def_use_mgr->GetDef(type_index);
  const uint32_t format = type->GetSingleWordInOperand(kOpTypeImageFormatIndex);
  const bool is_unknown = spv::ImageFormat(format) == spv::ImageFormat::Unknown;
  return is_unknown
             ? std::optional(spv::Capability::StorageImageWriteWithoutFormat)
             : std::nullopt;
}